

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O2

string * __thiscall
osqp::ToString_abi_cxx11_(string *__return_storage_ptr__,osqp *this,OsqpExitCode exitcode)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "OsqpExitCode::kOptimal";
    __a = &local_9;
    break;
  case 1:
    __s = "OsqpExitCode::kPrimalInfeasible";
    __a = &local_a;
    break;
  case 2:
    __s = "OsqpExitCode::kDualInfeasible";
    __a = &local_b;
    break;
  case 3:
    __s = "OsqpExitCode::kOptimalInaccurate";
    __a = &local_c;
    break;
  case 4:
    __s = "OsqpExitCode::kPrimalInfeasibleInaccurate";
    __a = &local_d;
    break;
  case 5:
    __s = "OsqpExitCode::kDualInfeasibleInaccurate";
    __a = &local_e;
    break;
  case 6:
    __s = "OsqpExitCode::kMaxIterations";
    __a = &local_f;
    break;
  case 7:
    __s = "OsqpExitCode::kInterrupted";
    __a = &local_10;
    break;
  case 8:
    __s = "OsqpExitCode::kTimeLimitReached";
    __a = &local_11;
    break;
  case 9:
    __s = "OsqpExitCode::kNonConvex";
    __a = &local_12;
    break;
  case 10:
    __s = "OsqpExitCode::kUnknown";
    __a = &local_13;
    break;
  default:
    __s = "Unknown exit code";
    __a = &local_14;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(OsqpExitCode exitcode) {
  switch (exitcode) {
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kOptimal);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kPrimalInfeasible);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kDualInfeasible);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kOptimalInaccurate);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kPrimalInfeasibleInaccurate);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kDualInfeasibleInaccurate);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kMaxIterations);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kInterrupted);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kTimeLimitReached);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kNonConvex);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kUnknown);
  }
  return "Unknown exit code";
}